

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_dates.c
# Opt level: O1

exception_type_t parse_exception_type(char *value)

{
  int iVar1;
  exception_type_t eVar2;
  
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    eVar2 = ET_ADDED;
  }
  else {
    iVar1 = strcmp(value,"2");
    eVar2 = ET_NOT_SET - (iVar1 == 0);
  }
  return eVar2;
}

Assistant:

exception_type_t parse_exception_type(const char *value) {
    if (strcmp(value, "1") == 0)
        return ET_ADDED;
    else if (strcmp(value, "2") == 0)
        return ET_REMOVED;
    else
        return ET_NOT_SET;
}